

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O2

int phr_parse_headers(char *buf_start,size_t len,phr_header *headers,size_t *num_headers,
                     size_t last_len)

{
  size_t max_headers;
  char *pcVar1;
  int r;
  int local_2c;
  
  max_headers = *num_headers;
  *num_headers = 0;
  if (((last_len == 0) ||
      (pcVar1 = is_complete(buf_start,buf_start + len,last_len,&local_2c), pcVar1 != (char *)0x0))
     && (pcVar1 = parse_headers(buf_start,buf_start + len,headers,num_headers,max_headers,&local_2c)
        , pcVar1 != (char *)0x0)) {
    local_2c = (int)pcVar1 - (int)buf_start;
  }
  return local_2c;
}

Assistant:

int phr_parse_headers(const char *buf_start, size_t len, struct phr_header *headers, size_t *num_headers, size_t last_len)
{
    const char *buf = buf_start, *buf_end = buf + len;
    size_t max_headers = *num_headers;
    int r;

    *num_headers = 0;

    /* if last_len != 0, check if the response is complete (a fast countermeasure
       against slowloris */
    if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
        return r;
    }

    if ((buf = parse_headers(buf, buf_end, headers, num_headers, max_headers, &r)) == NULL) {
        return r;
    }

    return (int)(buf - buf_start);
}